

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O3

bool __thiscall DMenu::MouseEventBack(DMenu *this,int type,int x,int y)

{
  byte bVar1;
  FTexture *pFVar2;
  int iVar3;
  uint uVar4;
  
  if (m_show_backbutton.Value < 0) {
    bVar1 = 0;
  }
  else {
    pFVar2 = FTextureManager::operator()(&TexMan,gameinfo.mBackButton.Chars);
    if (pFVar2 != (FTexture *)0x0) {
      if ((m_show_backbutton.Value & 1U) != 0) {
        uVar4 = (uint)((double)((uint)pFVar2->Width * 2) / (pFVar2->Scale).X);
        x = (x - (screen->super_DSimpleCanvas).super_DCanvas.Width) +
            ((uVar4 & 1) + ((int)uVar4 >> 1)) * CleanXfac;
      }
      if ((m_show_backbutton.Value & 2U) != 0) {
        uVar4 = (uint)((double)((uint)pFVar2->Height * 2) / (pFVar2->Scale).Y);
        y = (y - (screen->super_DSimpleCanvas).super_DCanvas.Height) +
            ((uVar4 & 1) + ((int)uVar4 >> 1)) * CleanYfac;
      }
      if (((-1 < x) &&
          (uVar4 = (uint)((double)((uint)pFVar2->Width * 2) / (pFVar2->Scale).X),
          x < (int)(((uVar4 & 1) + ((int)uVar4 >> 1)) * CleanXfac))) && (-1 < y)) {
        uVar4 = (uint)((double)((uint)pFVar2->Height * 2) / (pFVar2->Scale).Y);
        iVar3 = ((uVar4 & 1) + ((int)uVar4 >> 1)) * CleanYfac;
        bVar1 = y < iVar3;
        (this->super_DObject).field_0x25 = y < iVar3;
        if ((type == 2) && (y < iVar3)) {
          if (m_use_mouse.Value == 2) {
            (this->super_DObject).field_0x25 = 0;
          }
          (*(this->super_DObject)._vptr_DObject[8])(this,7,1);
          bVar1 = (this->super_DObject).field_0x25;
        }
        goto LAB_0030c519;
      }
      (this->super_DObject).field_0x25 = 0;
    }
    bVar1 = 0;
  }
LAB_0030c519:
  return (bool)(bVar1 & 1);
}

Assistant:

bool DMenu::MouseEventBack(int type, int x, int y)
{
	if (m_show_backbutton >= 0)
	{
		FTexture *tex = TexMan(gameinfo.mBackButton);
		if (tex != NULL)
		{
			if (m_show_backbutton&1) x -= screen->GetWidth() - tex->GetScaledWidth() * CleanXfac;
			if (m_show_backbutton&2) y -= screen->GetHeight() - tex->GetScaledHeight() * CleanYfac;
			mBackbuttonSelected = ( x >= 0 && x < tex->GetScaledWidth() * CleanXfac && 
									y >= 0 && y < tex->GetScaledHeight() * CleanYfac);
			if (mBackbuttonSelected && type == MOUSE_Release)
			{
				if (m_use_mouse == 2) mBackbuttonSelected = false;
				MenuEvent(MKEY_Back, true);
			}
			return mBackbuttonSelected;
		}
	}
	return false;
}